

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::FieldDescriptorProto::FieldDescriptorProto(FieldDescriptorProto *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__FieldDescriptorProto_003c6d30;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  this->number_ = 0;
  this->label_ = 0;
  this->type_ = 0;
  (this->type_name_)._M_dataplus._M_p = (pointer)&(this->type_name_).field_2;
  (this->type_name_)._M_string_length = 0;
  (this->type_name_).field_2._M_local_buf[0] = '\0';
  (this->extendee_)._M_dataplus._M_p = (pointer)&(this->extendee_).field_2;
  (this->extendee_)._M_string_length = 0;
  (this->extendee_).field_2._M_local_buf[0] = '\0';
  (this->default_value_)._M_dataplus._M_p = (pointer)&(this->default_value_).field_2;
  (this->default_value_)._M_string_length = 0;
  (this->default_value_).field_2._M_local_buf[0] = '\0';
  this->oneof_index_ = 0;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

FieldDescriptorProto::FieldDescriptorProto() = default;